

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O3

region * __thiscall
toml::detail::character_in_range::scan
          (region *__return_storage_ptr__,character_in_range *this,location *loc)

{
  byte bVar1;
  element_type *peVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  location first;
  location local_58;
  
  peVar2 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar3 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (((loc->location_ <
        (ulong)((long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - lVar3)) &&
      (bVar1 = *(byte *)(lVar3 + loc->location_), this->from_ <= bVar1)) && (bVar1 <= this->to_)) {
    location::location(&local_58,loc);
    peVar2 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar5 = loc->location_;
    lVar3 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - lVar3;
    if (uVar5 + 1 < uVar6) {
      if (*(char *)(lVar3 + uVar5) == '\n') {
        loc->line_number_ = loc->line_number_ + 1;
        sVar4 = 1;
      }
      else {
        sVar4 = loc->column_number_ + 1;
      }
      loc->column_number_ = sVar4;
      uVar7 = uVar5 + 1;
    }
    else {
      uVar7 = uVar5;
      if (uVar6 != uVar5) {
        sVar4 = loc->line_number_;
        sVar8 = loc->column_number_;
        do {
          if (*(char *)(lVar3 + uVar5) == '\n') {
            sVar4 = sVar4 + 1;
            loc->line_number_ = sVar4;
            sVar8 = 1;
          }
          else {
            sVar8 = sVar8 + 1;
          }
          loc->column_number_ = sVar8;
          uVar5 = uVar5 + 1;
          uVar7 = uVar6;
        } while (uVar6 != uVar5);
      }
    }
    loc->location_ = uVar7;
    (__return_storage_ptr__->source_).
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_58.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (__return_storage_ptr__->source_).
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_58.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_58.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_58.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_58.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_58.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_58.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    (__return_storage_ptr__->source_name_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->source_name_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->source_name_,
               local_58.source_name_._M_dataplus._M_p,
               local_58.source_name_._M_dataplus._M_p + local_58.source_name_._M_string_length);
    __return_storage_ptr__->first_ = local_58.location_;
    __return_storage_ptr__->first_line_ = local_58.line_number_;
    __return_storage_ptr__->first_column_ = local_58.column_number_;
    sVar4 = loc->location_;
    sVar8 = loc->line_number_;
    __return_storage_ptr__->length_ = sVar4 - local_58.location_;
    __return_storage_ptr__->last_ = sVar4;
    __return_storage_ptr__->last_line_ = sVar8;
    __return_storage_ptr__->last_column_ = loc->column_number_;
    location::~location(&local_58);
  }
  else {
    region::region(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE region character_in_range::scan(location& loc) const
{
    if(loc.eof()) {return region{};}

    const auto curr = loc.current();
    if(this->from_ <= curr && curr <= this->to_)
    {
        const auto first = loc;
        loc.advance(1);
        return region(first, loc);
    }
    return region{};
}